

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::interpolation
          (MLCellLinOp *this,int amrlev,int fmglev,MultiFab *fine,MultiFab *crse)

{
  pointer pIVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  uVar2 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  if (amrlev < 1) {
    pIVar1 = (this->super_MLLinOp).mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = pIVar1[fmglev].vect[0];
    iVar9 = pIVar1[fmglev].vect[1];
    iVar8 = pIVar1[fmglev].vect[2];
  }
  else {
    iVar7 = 2;
    iVar9 = iVar7;
    iVar8 = iVar7;
  }
  MFIter::MFIter(&mfi,(FabArrayBase *)fine,true);
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_12c,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_d0,&crse->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,&fine->super_FabArray<amrex::FArrayBox>,&mfi);
    for (uVar12 = 0; uVar5 = local_12c.smallend.vect[2], uVar12 != uVar2; uVar12 = uVar12 + 1) {
      for (; (int)uVar5 <= local_12c.bigend.vect[2]; uVar5 = uVar5 + 1) {
        lVar6 = ((long)(int)uVar5 - (long)local_110.begin.z) * local_110.kstride;
        for (uVar11 = (long)local_12c.smallend.vect[1];
            (long)uVar11 <= (long)local_12c.bigend.vect[1]; uVar11 = uVar11 + 1) {
          if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
            uVar10 = (uint)uVar11;
            lVar4 = (uVar11 - (long)local_110.begin.y) * local_110.jstride;
            uVar13 = (long)local_12c.smallend.vect[0];
            do {
              uVar14 = (uint)uVar13;
              if (iVar7 != 1) {
                if (iVar7 == 4) {
                  if ((long)uVar13 < 0) {
                    uVar14 = (int)uVar14 >> 2;
                  }
                  else {
                    uVar14 = uVar14 >> 2;
                  }
                }
                else if (iVar7 == 2) {
                  if ((long)uVar13 < 0) {
                    uVar14 = (int)uVar14 >> 1;
                  }
                  else {
                    uVar14 = uVar14 >> 1;
                  }
                }
                else if ((long)uVar13 < 0) {
                  uVar14 = ~((int)~uVar14 / iVar7);
                }
                else {
                  uVar14 = (uint)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                        uVar13 & 0xffffffff) / (long)iVar7);
                }
              }
              uVar15 = uVar10;
              if (((iVar9 != 1) && (uVar15 = (int)uVar10 >> 2, iVar9 != 4)) &&
                 (uVar15 = (int)uVar10 >> 1, iVar9 != 2)) {
                if ((long)uVar11 < 0) {
                  uVar15 = ~((int)~uVar10 / iVar9);
                }
                else {
                  uVar15 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                        uVar11 & 0xffffffff) / (long)iVar9);
                }
              }
              uVar3 = uVar5;
              if (((iVar8 != 1) && (uVar3 = (int)uVar5 >> 2, iVar8 != 4)) &&
                 (uVar3 = (int)uVar5 >> 1, iVar8 != 2)) {
                if ((int)uVar5 < 0) {
                  uVar3 = ~((int)~uVar5 / iVar8);
                }
                else {
                  uVar3 = (int)uVar5 / iVar8;
                }
              }
              local_110.p
              [lVar6 + local_110.nstride * uVar12 + lVar4 + (uVar13 - (long)local_110.begin.x)] =
                   local_d0.p
                   [((long)(int)uVar15 - (long)local_d0.begin.y) * local_d0.jstride +
                    ((long)(int)uVar14 - (long)local_d0.begin.x) +
                    ((long)(int)uVar3 - (long)local_d0.begin.z) * local_d0.kstride +
                    local_d0.nstride * uVar12] +
                   local_110.p
                   [lVar6 + local_110.nstride * uVar12 + lVar4 + (uVar13 - (long)local_110.begin.x)]
              ;
              uVar13 = uVar13 + 1;
            } while ((int)uVar13 != local_12c.bigend.vect[0] + 1);
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MLCellLinOp::interpolation (int amrlev, int fmglev, MultiFab& fine, const MultiFab& crse) const
{
#ifdef AMREX_SOFT_PERF_COUNTERS
    perf_counters.interpolate(fine);
#endif

    const int ncomp = getNComp();

    Dim3 ratio3 = {2,2,2};
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[fmglev];
    AMREX_D_TERM(ratio3.x = ratio[0];,
                 ratio3.y = ratio[1];,
                 ratio3.z = ratio[2];);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && fine.isFusingCandidate()) {
        auto const& finema = fine.arrays();
        auto const& crsema = crse.const_arrays();
        ParallelFor(fine, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            int ic = amrex::coarsen(i,ratio3.x);
            int jc = amrex::coarsen(j,ratio3.y);
            int kc = amrex::coarsen(k,ratio3.z);
            finema[box_no](i,j,k,n) += crsema[box_no](ic,jc,kc,n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx    = mfi.tilebox();
            Array4<Real const> const& cfab = crse.const_array(mfi);
            Array4<Real> const& ffab = fine.array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                int ic = amrex::coarsen(i,ratio3.x);
                int jc = amrex::coarsen(j,ratio3.y);
                int kc = amrex::coarsen(k,ratio3.z);
                ffab(i,j,k,n) += cfab(ic,jc,kc,n);
            });
        }
    }
}